

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::gles2::Functional::BlendCase::iterate(BlendCase *this)

{
  ReferenceQuadRenderer *pRVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  int iVar4;
  int iVar5;
  GLenum GVar6;
  deBool dVar7;
  char *str;
  RenderTarget *pRVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  RenderContext *context;
  PixelFormat *this_00;
  TestContext *pTVar11;
  size_type sVar12;
  float red;
  float green;
  float blue;
  float alpha;
  ConstPixelBufferAccess local_df8;
  ConstPixelBufferAccess local_dd0;
  undefined1 local_da5;
  undefined1 local_da4 [7];
  bool comparePass;
  Vector<unsigned_int,_4> local_d94;
  Vector<unsigned_int,_4> local_d84;
  deUint32 local_d74;
  RGBA local_d70 [4];
  Vector<unsigned_int,_4> local_d60;
  Vector<unsigned_int,_4> local_d50;
  Vector<unsigned_int,_4> local_d40;
  undefined1 local_d30 [8];
  UVec4 compareThreshold;
  PixelBufferAccess local_cf8;
  PixelBufferAccess local_cd0;
  PixelBufferAccess local_ca8;
  PixelBufferAccess local_c80;
  PixelBufferAccess local_c58;
  PixelBufferAccess local_c30;
  undefined1 local_c08 [8];
  PixelBufferAccess nullAccess;
  float local_bd8;
  float local_bd4;
  MessageBuilder local_bd0;
  char *local_a50;
  MessageBuilder local_a48;
  char *local_8c8;
  MessageBuilder local_8c0;
  char *local_740;
  MessageBuilder local_738;
  char *local_5b8;
  MessageBuilder local_5b0;
  char *local_430;
  MessageBuilder local_428;
  char *local_2a8;
  MessageBuilder local_2a0;
  undefined1 local_120 [8];
  FragmentOperationState referenceState;
  BlendParams *paramSet;
  TestLog *log;
  Surface referenceImg;
  Surface renderedImg;
  int viewportY;
  undefined1 local_28 [4];
  int viewportX;
  Random rnd;
  BlendCase *this_local;
  
  rnd.m_rnd._8_8_ = this;
  str = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(str);
  dVar3 = deInt32Hash(this->m_curParamSetNdx);
  de::Random::Random((Random *)local_28,dVar2 ^ dVar3);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar4 = tcu::RenderTarget::getWidth(pRVar8);
  iVar4 = de::Random::getInt((Random *)local_28,0,iVar4 - this->m_viewportW);
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar5 = tcu::RenderTarget::getHeight(pRVar8);
  iVar5 = de::Random::getInt((Random *)local_28,0,iVar5 - this->m_viewportH);
  tcu::Surface::Surface((Surface *)&referenceImg.m_pixels.m_cap,this->m_viewportW,this->m_viewportH)
  ;
  tcu::Surface::Surface((Surface *)&log,this->m_viewportH,this->m_viewportH);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  referenceState._152_8_ =
       std::
       vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
       ::operator[](&this->m_paramSets,(long)this->m_curParamSetNdx);
  rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)local_120);
  tcu::TestLog::operator<<(&local_2a0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_2a0,(char (*) [16])"RGB equation = ");
  local_2a8 = glu::getBlendEquationName(*(int *)referenceState._152_8_);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_2a8);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2a0);
  tcu::TestLog::operator<<(&local_428,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_428,(char (*) [16])"RGB src func = ");
  local_430 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 4));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_430);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_428);
  tcu::TestLog::operator<<(&local_5b0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_5b0,(char (*) [16])"RGB dst func = ");
  local_5b8 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 8));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_5b8);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_5b0);
  tcu::TestLog::operator<<(&local_738,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_738,(char (*) [18])"Alpha equation = ");
  local_740 = glu::getBlendEquationName(*(int *)(referenceState._152_8_ + 0xc));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_740);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_738);
  tcu::TestLog::operator<<(&local_8c0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_8c0,(char (*) [18])"Alpha src func = ");
  local_8c8 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 0x10));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_8c8);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_8c0);
  tcu::TestLog::operator<<(&local_a48,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_a48,(char (*) [18])"Alpha dst func = ");
  local_a50 = glu::getBlendFactorName(*(int *)(referenceState._152_8_ + 0x14));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_a50);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_a48);
  tcu::TestLog::operator<<(&local_bd0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar10 = tcu::MessageBuilder::operator<<(&local_bd0,(char (*) [16])"Blend color = (");
  local_bd4 = tcu::Vector<float,_4>::x((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_bd4);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0xafd70f);
  local_bd8 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,&local_bd8);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0xafd70f);
  nullAccess.super_ConstPixelBufferAccess.m_data._4_4_ =
       tcu::Vector<float,_4>::z((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar10 = tcu::MessageBuilder::operator<<
                      (pMVar10,(float *)((long)&nullAccess.super_ConstPixelBufferAccess.m_data + 4))
  ;
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [3])0xafd70f);
  nullAccess.super_ConstPixelBufferAccess.m_data._0_4_ =
       tcu::Vector<float,_4>::w((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
  pMVar10 = tcu::MessageBuilder::operator<<
                      (pMVar10,(float *)&nullAccess.super_ConstPixelBufferAccess.m_data);
  pMVar10 = tcu::MessageBuilder::operator<<(pMVar10,(char (*) [2])0xb1d50e);
  tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_bd0);
  do {
    glwBlendEquationSeparate
              (*(GLenum *)referenceState._152_8_,*(GLenum *)(referenceState._152_8_ + 0xc));
    GVar6 = glwGetError();
    glu::checkError(GVar6,"glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                    ,0xe7);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  do {
    glwBlendFuncSeparate
              (*(GLenum *)(referenceState._152_8_ + 4),*(GLenum *)(referenceState._152_8_ + 8),
               *(GLenum *)(referenceState._152_8_ + 0x10),*(GLenum *)(referenceState._152_8_ + 0x14)
              );
    GVar6 = glwGetError();
    glu::checkError(GVar6,
                    "glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                    ,0xe8);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  do {
    red = tcu::Vector<float,_4>::x((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    green = tcu::Vector<float,_4>::y((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    blue = tcu::Vector<float,_4>::z((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    alpha = tcu::Vector<float,_4>::w((Vector<float,_4> *)(referenceState._152_8_ + 0x18));
    glwBlendColor(red,green,blue,alpha);
    GVar6 = glwGetError();
    glu::checkError(GVar6,
                    "glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w())"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fBlendTests.cpp"
                    ,0xe9);
    dVar7 = ::deGetFalse();
  } while (dVar7 != 0);
  referenceState._88_4_ = sglr::rr_util::mapGLBlendEquation(*(deUint32 *)referenceState._152_8_);
  referenceState.blendMode =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 4));
  referenceState.blendRGBState.equation =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 8));
  referenceState.blendRGBState.srcFunc =
       sglr::rr_util::mapGLBlendEquation(*(deUint32 *)(referenceState._152_8_ + 0xc));
  referenceState.blendRGBState.dstFunc =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 0x10));
  referenceState.blendAState.equation =
       sglr::rr_util::mapGLBlendFunc(*(deUint32 *)(referenceState._152_8_ + 0x14));
  referenceState.blendAState._4_8_ = *(undefined8 *)(referenceState._152_8_ + 0x18);
  referenceState.blendColor.m_data._0_8_ = *(undefined8 *)(referenceState._152_8_ + 0x20);
  glwDisable(0xbe2);
  glwViewport(iVar4,iVar5,this->m_viewportW,this->m_viewportH);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_firstQuad);
  glwEnable(0xbe2);
  deqp::gls::FragmentOpUtil::QuadRenderer::render(this->m_renderer,&this->m_secondQuad);
  glwFlush();
  tcu::PixelBufferAccess::PixelBufferAccess((PixelBufferAccess *)local_c08);
  referenceState.depthFunc = TESTFUNC_NEVER;
  pRVar1 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess(&local_c58,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_c30,&local_c58);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar1,&local_c30,(PixelBufferAccess *)local_c08,(PixelBufferAccess *)local_c08,
             &this->m_firstQuadInt,(FragmentOperationState *)local_120);
  referenceState.depthFunc = TESTFUNC_ALWAYS;
  pRVar1 = this->m_referenceRenderer;
  tcu::TextureLevel::getAccess(&local_ca8,this->m_refColorBuffer);
  deqp::gls::FragmentOpUtil::getMultisampleAccess(&local_c80,&local_ca8);
  deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
            (pRVar1,&local_c80,(PixelBufferAccess *)local_c08,(PixelBufferAccess *)local_c08,
             &this->m_secondQuadInt,(FragmentOperationState *)local_120);
  tcu::Surface::getAccess(&local_cd0,(Surface *)&log);
  tcu::TextureLevel::getAccess(&local_cf8,this->m_refColorBuffer);
  tcu::copy((EVP_PKEY_CTX *)&local_cd0,(EVP_PKEY_CTX *)&local_cf8);
  context = Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess
            ((PixelBufferAccess *)(compareThreshold.m_data + 2),
             (Surface *)&referenceImg.m_pixels.m_cap);
  glu::readPixels(context,iVar4,iVar5,(PixelBufferAccess *)(compareThreshold.m_data + 2));
  pRVar8 = Context::getRenderTarget((this->super_TestCase).m_context);
  this_00 = tcu::RenderTarget::getPixelFormat(pRVar8);
  local_d74 = (deUint32)tcu::PixelFormat::getColorThreshold(this_00);
  tcu::RGBA::toIVec(local_d70);
  tcu::Vector<int,_4>::asUint((Vector<int,_4> *)&local_d60);
  tcu::Vector<unsigned_int,_4>::Vector(&local_d84,5);
  tcu::operator*((tcu *)&local_d50,&local_d60,&local_d84);
  tcu::Vector<unsigned_int,_4>::Vector(&local_d94,2);
  tcu::operator/((tcu *)&local_d40,&local_d50,&local_d94);
  tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)local_da4,3);
  tcu::operator+((tcu *)local_d30,&local_d40,(Vector<unsigned_int,_4> *)local_da4);
  pTVar9 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_dd0,(Surface *)&log);
  tcu::Surface::getAccess((PixelBufferAccess *)&local_df8,(Surface *)&referenceImg.m_pixels.m_cap);
  local_da5 = tcu::intThresholdCompare
                        (pTVar9,"CompareResult","Image Comparison Result",&local_dd0,&local_df8,
                         (UVec4 *)local_d30,COMPARE_LOG_RESULT);
  if ((bool)local_da5) {
    this->m_curParamSetNdx = this->m_curParamSetNdx + 1;
    iVar4 = this->m_curParamSetNdx;
    sVar12 = std::
             vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
             ::size(&this->m_paramSets);
    if (iVar4 < (int)sVar12) {
      this_local._4_4_ = CONTINUE;
    }
    else {
      pTVar11 = Context::getTestContext((this->super_TestCase).m_context);
      tcu::TestContext::setTestResult(pTVar11,QP_TEST_RESULT_PASS,"Passed");
      this_local._4_4_ = STOP;
    }
  }
  else {
    pTVar11 = Context::getTestContext((this->super_TestCase).m_context);
    tcu::TestContext::setTestResult(pTVar11,QP_TEST_RESULT_FAIL,"Image compare failed");
    this_local._4_4_ = STOP;
  }
  tcu::Surface::~Surface((Surface *)&log);
  tcu::Surface::~Surface((Surface *)&referenceImg.m_pixels.m_cap);
  de::Random::~Random((Random *)local_28);
  return this_local._4_4_;
}

Assistant:

BlendCase::IterateResult BlendCase::iterate (void)
{
	de::Random						rnd				(deStringHash(getName()) ^ deInt32Hash(m_curParamSetNdx));
	int								viewportX		= rnd.getInt(0, m_context.getRenderTarget().getWidth() - m_viewportW);
	int								viewportY		= rnd.getInt(0, m_context.getRenderTarget().getHeight() - m_viewportH);
	tcu::Surface					renderedImg		(m_viewportW, m_viewportH);
	tcu::Surface					referenceImg	(m_viewportH, m_viewportH);
	TestLog&						log				(m_testCtx.getLog());
	const BlendParams&				paramSet		= m_paramSets[m_curParamSetNdx];
	rr::FragmentOperationState		referenceState;

	// Log the blend parameters.

	log << TestLog::Message << "RGB equation = " << getBlendEquationName(paramSet.equationRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB src func = " << getBlendFactorName(paramSet.srcFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "RGB dst func = " << getBlendFactorName(paramSet.dstFuncRGB) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha equation = " << getBlendEquationName(paramSet.equationAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha src func = " << getBlendFactorName(paramSet.srcFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Alpha dst func = " << getBlendFactorName(paramSet.dstFuncAlpha) << TestLog::EndMessage;
	log << TestLog::Message << "Blend color = (" << paramSet.blendColor.x() << ", " << paramSet.blendColor.y() << ", " << paramSet.blendColor.z() << ", " << paramSet.blendColor.w() << ")" << TestLog::EndMessage;

	// Set GL state.

	GLU_CHECK_CALL(glBlendEquationSeparate(paramSet.equationRGB, paramSet.equationAlpha));
	GLU_CHECK_CALL(glBlendFuncSeparate(paramSet.srcFuncRGB, paramSet.dstFuncRGB, paramSet.srcFuncAlpha, paramSet.dstFuncAlpha));
	GLU_CHECK_CALL(glBlendColor(paramSet.blendColor.x(), paramSet.blendColor.y(), paramSet.blendColor.z(), paramSet.blendColor.w()));

	// Set reference state.

	referenceState.blendRGBState.equation	= sglr::rr_util::mapGLBlendEquation(paramSet.equationRGB);
	referenceState.blendRGBState.srcFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncRGB);
	referenceState.blendRGBState.dstFunc	= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncRGB);
	referenceState.blendAState.equation		= sglr::rr_util::mapGLBlendEquation(paramSet.equationAlpha);
	referenceState.blendAState.srcFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.srcFuncAlpha);
	referenceState.blendAState.dstFunc		= sglr::rr_util::mapGLBlendFunc(paramSet.dstFuncAlpha);
	referenceState.blendColor				= paramSet.blendColor;

	// Render with GL.

	glDisable(GL_BLEND);
	glViewport(viewportX, viewportY, m_viewportW, m_viewportH);
	m_renderer->render(m_firstQuad);
	glEnable(GL_BLEND);
	m_renderer->render(m_secondQuad);
	glFlush();

	// Render reference.

	const tcu::PixelBufferAccess nullAccess = tcu::PixelBufferAccess();

	referenceState.blendMode = rr::BLENDMODE_NONE;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_firstQuadInt, referenceState);
	referenceState.blendMode = rr::BLENDMODE_STANDARD;
	m_referenceRenderer->render(gls::FragmentOpUtil::getMultisampleAccess(m_refColorBuffer->getAccess()), nullAccess /* no depth */, nullAccess /* no stencil */, m_secondQuadInt, referenceState);

	// Expand reference color buffer to RGBA8
	copy(referenceImg.getAccess(), m_refColorBuffer->getAccess());

	// Read GL image.

	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, renderedImg.getAccess());

	// Compare images.

	UVec4 compareThreshold = m_context.getRenderTarget().getPixelFormat().getColorThreshold().toIVec().asUint()
							 * UVec4(5) / UVec4(2) + UVec4(3); // \note Non-scientific ad hoc formula. Need big threshold when few color bits; blending brings extra inaccuracy.

	bool comparePass = tcu::intThresholdCompare(m_testCtx.getLog(), "CompareResult", "Image Comparison Result", referenceImg.getAccess(), renderedImg.getAccess(), compareThreshold, tcu::COMPARE_LOG_RESULT);

	// Fail now if images don't match.

	if (!comparePass)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Image compare failed");
		return STOP;
	}

	// Continue if param sets still remain in m_paramSets; otherwise stop.

	m_curParamSetNdx++;

	if (m_curParamSetNdx < (int)m_paramSets.size())
		return CONTINUE;
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Passed");
		return STOP;
	}
}